

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O2

string * __thiscall
pbrt::ImageMetadata::ToString_abi_cxx11_(string *__return_storage_ptr__,ImageMetadata *this)

{
  optional<const_pbrt::RGBColorSpace_*> *in_RAX;
  
  StringPrintf<pstd::optional<float>const&,pstd::optional<pbrt::SquareMatrix<4>>const&,pstd::optional<pbrt::SquareMatrix<4>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,pstd::optional<int>const&,pstd::optional<float>const&,pstd::optional<pbrt::RGBColorSpace_const*>const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ ImageMetadata renderTimeSeconds: %s cameraFromWorld: %s NDCFromWorld: %s pixelBounds: %s fullResolution: %s samplesPerPixel: %s MSE: %s colorSpace: %s ]"
             ,(char *)this,(optional<float> *)&this->cameraFromWorld,&this->NDCFromWorld,
             (optional<pbrt::SquareMatrix<4>_> *)&this->pixelBounds,
             (optional<pbrt::Bounds2<int>_> *)&this->fullResolution,
             (optional<pbrt::Point2<int>_> *)&this->samplesPerPixel,(optional<int> *)&this->MSE,
             (optional<float> *)&this->colorSpace,in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageMetadata::ToString() const {
    return StringPrintf("[ ImageMetadata renderTimeSeconds: %s cameraFromWorld: %s "
                        "NDCFromWorld: %s pixelBounds: %s fullResolution: %s "
                        "samplesPerPixel: %s MSE: %s colorSpace: %s ]",
                        renderTimeSeconds, cameraFromWorld, NDCFromWorld, pixelBounds,
                        fullResolution, samplesPerPixel, MSE, colorSpace);
}